

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O3

void stringcap(luaL_Buffer *b,CapState *cs)

{
  lua_State *L;
  char *s;
  Capture *pCVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  size_t len;
  StrAux cps [10];
  ulong local_130;
  undefined1 local_128 [8];
  undefined1 auStack_120 [240];
  
  L = cs->L;
  iVar3 = updatecache(cs,(uint)cs->cap->idx);
  pcVar5 = lua_tolstring(L,iVar3,&local_130);
  iVar3 = getstrcaps(cs,(StrAux *)local_128,0);
  if (local_130 != 0) {
    uVar8 = 0;
    do {
      cVar2 = pcVar5[uVar8];
      if (cVar2 == '%') {
        cVar2 = pcVar5[uVar8 + 1];
        uVar8 = uVar8 + 1;
        if ((byte)(cVar2 - 0x3aU) < 0xf6) {
          uVar6 = b->n;
          if (b->size <= uVar6) {
            luaL_prepbuffsize(b,1);
            cVar2 = pcVar5[uVar8];
            uVar6 = b->n;
          }
          b->n = uVar6 + 1;
          b->b[uVar6] = cVar2;
        }
        else {
          uVar7 = (uint)(byte)(cVar2 - 0x30U);
          if (iVar3 <= (int)(uint)(byte)(cVar2 - 0x30U)) {
            luaL_error(cs->L,"invalid capture index (%d)",(ulong)uVar7);
          }
          if (((StrAux *)local_128)[uVar7].isstring == 0) {
            pCVar1 = cs->cap;
            cs->cap = ((StrAux *)local_128)[uVar7].u.cp;
            iVar4 = addonestring(b,cs,"capture");
            if (iVar4 == 0) {
              luaL_error(cs->L,"no values in capture index %d",(ulong)uVar7);
            }
            cs->cap = pCVar1;
          }
          else {
            s = ((StrAux *)local_128)[uVar7].u.s.s;
            luaL_addlstring(b,s,(long)((StrAux *)local_128)[uVar7].u.s.e - (long)s);
          }
        }
      }
      else {
        uVar6 = b->n;
        if (b->size <= uVar6) {
          luaL_prepbuffsize(b,1);
          cVar2 = pcVar5[uVar8];
          uVar6 = b->n;
        }
        b->n = uVar6 + 1;
        b->b[uVar6] = cVar2;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < local_130);
  }
  return;
}

Assistant:

static void stringcap (luaL_Buffer *b, CapState *cs) {
  StrAux cps[MAXSTRCAPS];
  int n;
  size_t len, i;
  const char *fmt;  /* format string */
  fmt = lua_tolstring(cs->L, updatecache(cs, cs->cap->idx), &len);
  n = getstrcaps(cs, cps, 0) - 1;  /* collect nested captures */
  for (i = 0; i < len; i++) {  /* traverse them */
    if (fmt[i] != '%')  /* not an escape? */
      luaL_addchar(b, fmt[i]);  /* add it to buffer */
    else if (fmt[++i] < '0' || fmt[i] > '9')  /* not followed by a digit? */
      luaL_addchar(b, fmt[i]);  /* add to buffer */
    else {
      int l = fmt[i] - '0';  /* capture index */
      if (l > n)
        luaL_error(cs->L, "invalid capture index (%d)", l);
      else if (cps[l].isstring)
        luaL_addlstring(b, cps[l].u.s.s, cps[l].u.s.e - cps[l].u.s.s);
      else {
        Capture *curr = cs->cap;
        cs->cap = cps[l].u.cp;  /* go back to evaluate that nested capture */
        if (!addonestring(b, cs, "capture"))
          luaL_error(cs->L, "no values in capture index %d", l);
        cs->cap = curr;  /* continue from where it stopped */
      }
    }
  }
}